

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
FileTokenizer::createTokenCurrentString(FileTokenizer *this,TokenType type,size_t length)

{
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  Identifier local_90;
  string local_60 [8];
  string originalStr;
  string valueStr;
  size_t length_local;
  TokenType type_local;
  FileTokenizer *this_local;
  
  (this->token).type = type;
  (this->token).line = this->lineNumber;
  (this->token).column = this->linePos + 1;
  std::__cxx11::string::substr((ulong)((long)&originalStr.field_2 + 8),(ulong)&this->currentLine);
  std::__cxx11::string::substr((ulong)local_60,(ulong)&this->currentLine);
  if ((type == Identifier) || (type == Equ)) {
    std::__cxx11::string::string
              ((string *)&local_b0,(string *)(originalStr.field_2._M_local_buf + 8));
    Identifier::Identifier(&local_90,&local_b0);
    std::__cxx11::string::string((string *)&local_d0,local_60);
    Token::setValue<Identifier>(&this->token,&local_90,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    Identifier::~Identifier(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_f0,(string *)(originalStr.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_110,local_60);
    Token::setValue<std::__cxx11::string>(&this->token,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  this->linePos = length + this->linePos;
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)(originalStr.field_2._M_local_buf + 8));
  return;
}

Assistant:

void FileTokenizer::createTokenCurrentString(TokenType type, size_t length)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;

	std::string valueStr = currentLine.substr(linePos, length);
	std::string originalStr = currentLine.substr(linePos, length);
	if (type == TokenType::Identifier || type == TokenType::Equ)
		token.setValue(Identifier(std::move(valueStr)), std::move(originalStr));
	else
		token.setValue(std::move(valueStr), std::move(originalStr));

	linePos += length;
}